

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UErrorCode __thiscall
icu_63::RuleChain::getKeywords
          (RuleChain *this,int32_t capacityOfKeywords,UnicodeString *keywords,int32_t *arraySize)

{
  int iVar1;
  
  while( true ) {
    if (U_ZERO_ERROR < this->fInternalStatus) {
      return this->fInternalStatus;
    }
    iVar1 = *arraySize;
    if (capacityOfKeywords + -1 <= iVar1) break;
    *arraySize = iVar1 + 1;
    UnicodeString::operator=(keywords + iVar1,&this->fKeyword);
    this = this->fNext;
    if (this == (RuleChain *)0x0) {
      return U_ZERO_ERROR;
    }
  }
  return U_BUFFER_OVERFLOW_ERROR;
}

Assistant:

UErrorCode
RuleChain::getKeywords(int32_t capacityOfKeywords, UnicodeString* keywords, int32_t& arraySize) const {
    if (U_FAILURE(fInternalStatus)) {
        return fInternalStatus;
    }
    if ( arraySize < capacityOfKeywords-1 ) {
        keywords[arraySize++]=fKeyword;
    }
    else {
        return U_BUFFER_OVERFLOW_ERROR;
    }

    if ( fNext != nullptr ) {
        return fNext->getKeywords(capacityOfKeywords, keywords, arraySize);
    }
    else {
        return U_ZERO_ERROR;
    }
}